

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::EntryPoint,_8UL>::clear
          (SmallVector<diligent_spirv_cross::EntryPoint,_8UL> *this)

{
  EntryPoint *pEVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  
  if ((this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size != 0) {
    lVar4 = 0x10;
    uVar5 = 0;
    do {
      pEVar1 = (this->super_VectorView<diligent_spirv_cross::EntryPoint>).ptr;
      plVar2 = *(long **)((long)pEVar1 + lVar4 + -0x10);
      plVar3 = (long *)((long)&(pEVar1->name)._M_dataplus._M_p + lVar4);
      if (plVar3 != plVar2) {
        operator_delete(plVar2,*plVar3 + 1);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar5 < (this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size);
  }
  (this->super_VectorView<diligent_spirv_cross::EntryPoint>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}